

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

bcf_hrec_t * bcf_hdr_parse_line(bcf_hdr_t *h,char *line,int *len)

{
  char cVar1;
  bcf_hrec_t *hrec;
  char *pcVar2;
  ushort **ppuVar3;
  long lVar4;
  int iVar5;
  char cVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  size_t __n;
  char *pcVar10;
  ulong uVar11;
  bool bVar12;
  kstring_t tmp;
  kstring_t local_48;
  
  if ((*line == '#') && (line[1] == '#')) {
    lVar8 = 0;
    for (lVar4 = 0; (cVar1 = line[lVar4 + 2], cVar1 != '\0' && (cVar1 != '=')); lVar4 = lVar4 + 1) {
      lVar8 = lVar8 + 0x100000000;
    }
    if (cVar1 == '=' && (int)lVar4 != 0) {
      hrec = (bcf_hrec_t *)calloc(1,0x30);
      pcVar2 = (char *)malloc(lVar8 + 0x100000000 >> 0x20);
      hrec->key = pcVar2;
      memcpy(pcVar2,line + 2,lVar8 >> 0x20);
      pcVar2[lVar8 >> 0x20] = '\0';
      pcVar2 = line + lVar4 + 3;
      cVar1 = *pcVar2;
      if (cVar1 != '<') {
        lVar4 = lVar4 + 4;
        __n = 0;
        while ((cVar1 != '\0' && (cVar1 != '\n'))) {
          pcVar10 = line + lVar4;
          lVar4 = lVar4 + 1;
          __n = __n + 1;
          cVar1 = *pcVar10;
        }
        pcVar10 = (char *)malloc(__n + 1);
        hrec->value = pcVar10;
        memcpy(pcVar10,pcVar2,__n);
        pcVar10[__n] = '\0';
        *len = (int)lVar4;
        return hrec;
      }
      cVar1 = '<';
      iVar5 = 1;
      do {
        if ((cVar1 == '\n') || (iVar5 == 0)) break;
        pcVar10 = pcVar2 + 1;
        cVar1 = pcVar2[1];
        if (cVar1 == '\0') {
LAB_0011865b:
          cVar1 = '\0';
LAB_0011865e:
          iVar5 = (int)pcVar10 - (int)line;
          while ((pcVar10 = pcVar10 + 1, cVar1 != '\0' && (cVar1 != '\n'))) {
            iVar5 = iVar5 + 1;
            cVar1 = *pcVar10;
          }
          local_48.l = 0;
          local_48.m = 0;
          local_48.s = (char *)0x0;
          kputsn(line,iVar5,&local_48);
          pcVar2 = local_48.s;
          fprintf(_stderr,"Could not parse the header line: \"%s\"\n",local_48.s);
          free(pcVar2);
          *len = iVar5 + 1;
          bcf_hrec_destroy(hrec);
          return (bcf_hrec_t *)0x0;
        }
        ppuVar3 = __ctype_b_loc();
        lVar4 = 0;
        while (lVar8 = lVar4, ((*ppuVar3)[cVar1] & 8) != 0) {
          cVar1 = pcVar2[lVar8 + 2];
          lVar4 = lVar8 + 1;
          if (cVar1 == '\0') {
            pcVar10 = pcVar2 + lVar8 + 2;
            goto LAB_0011865b;
          }
        }
        if ((cVar1 != '=') || ((int)lVar8 == 0)) {
          pcVar10 = pcVar2 + lVar8 + 1;
          goto LAB_0011865e;
        }
        bcf_hrec_add_key(hrec,pcVar10,(int)lVar8);
        cVar1 = pcVar2[lVar8 + 2];
        pcVar10 = pcVar2 + lVar8 + 2;
        if (cVar1 == '\"') {
          pcVar10 = pcVar2 + lVar8 + 3;
        }
        cVar6 = *pcVar10;
        pcVar9 = pcVar10;
        while (cVar6 != '\0') {
          if (cVar1 == '\"') {
            if (cVar6 == '\"') {
              pcVar7 = pcVar9 + -1;
              if (pcVar7 < pcVar2 + lVar8 + 3) break;
              bVar12 = false;
              do {
                if (*pcVar7 != '\\') break;
                bVar12 = (bool)(bVar12 ^ 1);
                pcVar7 = pcVar7 + -1;
              } while (pcVar10 <= pcVar7);
              if (!bVar12) break;
            }
          }
          else {
            iVar5 = (iVar5 + (uint)(cVar6 == '<')) - (uint)(cVar6 == '>');
            if (iVar5 == 0) {
              iVar5 = 0;
              break;
            }
            if ((cVar6 == ',') && (iVar5 == 1)) {
              iVar5 = 1;
              break;
            }
          }
          pcVar7 = pcVar9 + 1;
          pcVar9 = pcVar9 + 1;
          cVar6 = *pcVar7;
        }
        uVar11 = (ulong)(cVar1 == '\"');
        bcf_hrec_set_val(hrec,hrec->nkeys + -1,pcVar10,(int)pcVar9 - (int)pcVar10,
                         (uint)(cVar1 == '\"'));
        bVar12 = pcVar9[uVar11] == '>';
        pcVar2 = pcVar9 + bVar12 + uVar11;
        iVar5 = iVar5 - (uint)bVar12;
        cVar1 = pcVar9[bVar12 + uVar11];
      } while (cVar1 != '\0');
      *len = ((int)pcVar2 - (int)line) + 1;
      return hrec;
    }
    *len = (int)lVar4 + 3;
  }
  else {
    *len = 0;
  }
  return (bcf_hrec_t *)0x0;
}

Assistant:

bcf_hrec_t *bcf_hdr_parse_line(const bcf_hdr_t *h, const char *line, int *len)
{
    const char *p = line;
    if (p[0] != '#' || p[1] != '#') { *len = 0; return NULL; }
    p += 2;

    const char *q = p;
    while ( *q && *q!='=' ) q++;
    int n = q-p;
    if ( *q!='=' || !n ) { *len = q-line+1; return NULL; } // wrong format

    bcf_hrec_t *hrec = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
    hrec->key = (char*) malloc(sizeof(char)*(n+1));
    memcpy(hrec->key,p,n);
    hrec->key[n] = 0;

    p = ++q;
    if ( *p!='<' ) // generic field, e.g. ##samtoolsVersion=0.1.18-r579
    {
        while ( *q && *q!='\n' ) q++;
        hrec->value = (char*) malloc((q-p+1)*sizeof(char));
        memcpy(hrec->value, p, q-p);
        hrec->value[q-p] = 0;
        *len = q-line+1;
        return hrec;
    }

    // structured line, e.g. ##INFO=<ID=PV1,Number=1,Type=Float,Description="P-value for baseQ bias">
    int nopen = 1;
    while ( *q && *q!='\n' && nopen )
    {
        p = ++q;
        while ( *q && isalnum(*q) ) q++;
        n = q-p;
        if ( *q!='=' || !n )
        {
            // wrong format
            while ( *q && *q!='\n' ) q++;
            kstring_t tmp = {0,0,0};
            kputsn(line,q-line,&tmp);
            fprintf(stderr,"Could not parse the header line: \"%s\"\n", tmp.s);
            free(tmp.s);
            *len = q-line+1;
            bcf_hrec_destroy(hrec);
            return NULL;
        }
        bcf_hrec_add_key(hrec, p, q-p);
        p = ++q;
        int quoted = *p=='"' ? 1 : 0;
        if ( quoted ) p++, q++;
        while (1)
        {
            if ( !*q ) break;
            if ( quoted ) { if ( *q=='"' && !is_escaped(p,q) ) break; }
            else
            {
                if ( *q=='<' ) nopen++;
                if ( *q=='>' ) nopen--;
                if ( !nopen ) break;
                if ( *q==',' && nopen==1 ) break;
            }
            q++;
        }
        bcf_hrec_set_val(hrec, hrec->nkeys-1, p, q-p, quoted);
        if ( quoted ) q++;
        if ( *q=='>' ) { nopen--; q++; }
    }
    *len = q-line+1;
    return hrec;
}